

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawWallRevSubClamp4PalCommand::Execute
          (DrawWallRevSubClamp4PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  int iVar10;
  int pass_skip;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint8_t *puVar14;
  int i;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined4 uVar19;
  uint local_48 [4];
  undefined8 local_38;
  ulong uStack_30;
  
  iVar10 = (this->super_PalWall4Command)._count;
  iVar1 = (this->super_PalWall4Command)._fracbits;
  puVar3 = (this->super_PalWall4Command)._srcblend;
  puVar4 = (this->super_PalWall4Command)._destblend;
  uVar7 = *(undefined8 *)(this->super_PalWall4Command)._texturefrac;
  uVar8 = *(undefined8 *)((this->super_PalWall4Command)._texturefrac + 2);
  uVar17 = *(ulong *)(this->super_PalWall4Command)._iscale;
  uStack_30 = *(ulong *)((this->super_PalWall4Command)._iscale + 2);
  iVar2 = (this->super_PalWall4Command).super_DrawerCommand._dest_y;
  iVar12 = thread->pass_end_y - iVar2;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  if (iVar10 < iVar12) {
    iVar12 = iVar10;
  }
  uVar11 = thread->pass_start_y - iVar2;
  if ((int)uVar11 < 1) {
    uVar11 = 0;
  }
  uVar13 = thread->num_cores;
  iVar10 = (int)(uVar13 - (int)((iVar2 + uVar11) - thread->core) % (int)uVar13) % (int)uVar13;
  uVar5 = (long)(int)((~uVar11 + uVar13 + iVar12) - iVar10) / (long)(int)uVar13;
  uVar9 = uVar5 & 0xffffffff;
  if (0 < (int)uVar5) {
    uVar11 = iVar10 + uVar11;
    puVar14 = (this->super_PalWall4Command)._dest +
              (long)(this->super_PalWall4Command)._pitch * (long)(int)uVar11;
    auVar18._4_4_ = uVar11;
    auVar18._0_4_ = uVar11;
    auVar18._8_4_ = uVar11;
    auVar18._12_4_ = uVar11;
    iVar10 = (int)(uVar17 >> 0x20);
    uVar19 = (undefined4)(uStack_30 >> 0x20);
    auVar6._4_4_ = iVar10;
    auVar6._0_4_ = iVar10;
    auVar6._8_4_ = uVar19;
    auVar6._12_4_ = uVar19;
    local_48[0] = (uint)uVar7;
    local_48[1] = (uint)((ulong)uVar7 >> 0x20);
    local_48[2] = (uint)uVar8;
    local_48[3] = (uint)((ulong)uVar8 >> 0x20);
    local_48[1] = iVar10 * uVar11 + local_48[1];
    local_48[0] = (int)((ulong)uVar11 * (uVar17 & 0xffffffff)) + local_48[0];
    local_48[3] = (int)((auVar6._8_8_ & 0xffffffff) * (ulong)uVar11) + local_48[3];
    local_48[2] = (int)((auVar18._8_8_ & 0xffffffff) * (uStack_30 & 0xffffffff)) + local_48[2];
    local_38 = CONCAT44(iVar10 * uVar13,(int)((uVar17 & 0xffffffff) * (ulong)uVar13));
    do {
      lVar15 = 0;
      do {
        uVar11 = local_48[lVar15];
        uVar17 = (ulong)(this->super_PalWall4Command)._source[lVar15]
                        [uVar11 >> ((byte)iVar1 & 0x3f)];
        if (uVar17 != 0) {
          uVar13 = (puVar4[puVar14[lVar15]] | 0x40100400) -
                   puVar3[(this->super_PalWall4Command)._colormap[lVar15][uVar17]];
          uVar16 = uVar13 & 0x40100400;
          uVar13 = uVar16 - (uVar16 >> 5) & uVar13 | 0x1f07c1f;
          puVar14[lVar15] = RGB32k.All[uVar13 >> 0xf & uVar13];
        }
        local_48[lVar15] = uVar11 + *(int *)((long)&local_38 + lVar15 * 4);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      puVar14 = puVar14 + (this->super_PalWall4Command)._pitch;
      uVar11 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar11;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

void DrawWallRevSubClamp4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		uint32_t dc_wall_texturefrac[4] = { _texturefrac[0], _texturefrac[1], _texturefrac[2], _texturefrac[3] };
		uint32_t dc_wall_iscale[4] = { _iscale[0], _iscale[1], _iscale[2], _iscale[3] };

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int i = 0; i < 4; i++)
		{
			dc_wall_texturefrac[i] += dc_wall_iscale[i] * skipped;
			dc_wall_iscale[i] *= thread->num_cores;
		}
		pitch *= thread->num_cores;

		do
		{
			for (int i = 0; i < 4; ++i)
			{
				uint8_t pix = _source[i][dc_wall_texturefrac[i] >> bits];
				if (pix != 0)
				{
					uint32_t a = (bg2rgb[dest[i]] | 0x40100400) - fg2rgb[_colormap[i][pix]];
					uint32_t b = a;

					b &= 0x40100400;
					b = b - (b >> 5);
					a &= b;
					a |= 0x01f07c1f;
					dest[i] = RGB32k.All[a & (a >> 15)];
				}
				dc_wall_texturefrac[i] += dc_wall_iscale[i];
			}
			dest += _pitch;
		} while (--count);
	}